

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int32_t zng_deflatePending(zng_stream *strm,uint32_t *pending,int32_t *bits)

{
  int iVar1;
  int32_t *in_RDX;
  uint32_t *in_RSI;
  zng_stream *in_RDI;
  int32_t local_4;
  
  iVar1 = deflateStateCheck(in_RDI);
  if (iVar1 == 0) {
    if (in_RSI != (uint32_t *)0x0) {
      *in_RSI = in_RDI->state->pending;
    }
    if (in_RDX != (int32_t *)0x0) {
      *in_RDX = in_RDI->state->bi_valid;
    }
    local_4 = 0;
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int32_t Z_EXPORT PREFIX(deflatePending)(PREFIX3(stream) *strm, uint32_t *pending, int32_t *bits) {
    if (deflateStateCheck(strm))
        return Z_STREAM_ERROR;
    if (pending != NULL)
        *pending = strm->state->pending;
    if (bits != NULL)
        *bits = strm->state->bi_valid;
    return Z_OK;
}